

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<BoolView>::copyTo(vec<BoolView> *this,vec<BoolView> *copy)

{
  vec<BoolView> *in_RSI;
  BoolView *in_RDI;
  uint i;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint in_stack_ffffffffffffffec;
  uint index;
  
  clear((vec<BoolView> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
  growTo(in_RSI,in_stack_ffffffffffffffec);
  for (index = 0; index < *(uint *)&(in_RDI->super_Var).super_Branching._vptr_Branching;
      index = index + 1) {
    operator[](in_RSI,index);
    BoolView::BoolView(in_RDI,(BoolView *)
                              CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void copyTo(vec<T>& copy) const {
		copy.clear();
		copy.growTo(sz);
		for (unsigned int i = 0; i < sz; i++) {
			new (&copy[i]) T(data[i]);
		}
	}